

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmakemain.cxx
# Opt level: O3

int main(int ac,char **av)

{
  char *pcVar1;
  char *pcVar2;
  uint ac_00;
  int iVar3;
  int iVar4;
  char **av_00;
  uv_loop_t *loop;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t sVar5;
  string *psVar6;
  ulong uVar7;
  string target;
  string dir;
  string config;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  nativeOptions;
  CommandLineArguments args;
  string local_3a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_378;
  undefined8 local_368;
  ulong local_360;
  string local_358;
  string local_338;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_318;
  CommandLineArguments local_300;
  undefined1 local_2e8 [696];
  
  cmsys::Encoding::CommandLineArguments::Main(&local_300,ac,av);
  ac_00 = cmsys::Encoding::CommandLineArguments::argc(&local_300);
  av_00 = cmsys::Encoding::CommandLineArguments::argv(&local_300);
  cmsys::SystemTools::EnableMSVCDebugHook();
  cmSystemTools::FindCMakeResources(*av_00);
  if (1 < (int)ac_00) {
    pcVar1 = av_00[1];
    iVar3 = strcmp(pcVar1,"--build");
    if (iVar3 == 0) {
      local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
      local_3a8._M_string_length = 0;
      local_3a8.field_2._M_allocated_capacity =
           local_3a8.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
      local_338.field_2._M_allocated_capacity._0_4_ = 0x75626544;
      local_338.field_2._M_allocated_capacity._4_2_ = 0x67;
      local_338._M_string_length = 5;
      local_388._M_allocated_capacity = (size_type)&local_378;
      local_388._8_8_ = (char *)0x0;
      local_378._M_local_buf[0] = '\0';
      local_318.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_318.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_318.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      if (ac_00 == 2) {
LAB_00252a24:
        iVar3 = 1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "Usage: cmake --build <dir> [options] [-- [native-options]]\nOptions:\n  <dir>          = Project binary directory to be built.\n  --target <tgt> = Build <tgt> instead of default targets.\n                   May only be specified once.\n  --config <cfg> = For multi-configuration tools, choose <cfg>.\n  --clean-first  = Build target \'clean\' first, then build.\n                   (To clean only, use --target \'clean\'.)\n  --use-stderr   = Ignored.  Behavior is default in CMake >= 3.0.\n  --             = Pass remaining options to the native tool.\n"
                   ,0x21c);
      }
      else {
        iVar3 = 1;
        uVar7 = 2;
        local_360 = 0;
        local_368 = 0;
        do {
          if (iVar3 == 4) {
            std::__cxx11::string::string((string *)local_2e8,av_00[uVar7],(allocator *)&local_358);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_318,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2e8);
            if ((undefined1 *)local_2e8._0_8_ != local_2e8 + 0x10) {
              operator_delete((void *)local_2e8._0_8_,local_2e8._16_8_ + 1);
            }
            iVar3 = 4;
          }
          else {
            pcVar1 = av_00[uVar7];
            iVar4 = strcmp(pcVar1,"--target");
            if (iVar4 == 0) {
              if ((local_360 & 1) != 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,
                           "\'--target\' may not be specified more than once.\n\n",0x31);
                std::__cxx11::string::_M_replace
                          ((ulong)&local_388,0,(char *)local_388._8_8_,0x5944aa);
                break;
              }
              local_360 = CONCAT71((int7)(CONCAT44(extraout_var,iVar4) >> 8),1);
              iVar3 = 2;
            }
            else {
              iVar4 = strcmp(pcVar1,"--config");
              if (iVar4 == 0) {
                iVar3 = 3;
              }
              else {
                iVar4 = strcmp(pcVar1,"--clean-first");
                if (iVar4 == 0) {
                  local_368 = CONCAT71((int7)(CONCAT44(extraout_var_00,iVar4) >> 8),1);
                  iVar3 = 0;
                }
                else {
                  iVar4 = strcmp(pcVar1,"--use-stderr");
                  if (iVar4 != 0) {
                    if (((*pcVar1 == '-') && (pcVar1[1] == '-')) && (pcVar1[2] == '\0')) {
                      iVar3 = 4;
                    }
                    else {
                      psVar6 = &local_338;
                      if (iVar3 != 3) {
                        if (iVar3 != 2) {
                          if (iVar3 == 1) {
                            local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
                            sVar5 = strlen(pcVar1);
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)&local_358,pcVar1,pcVar1 + sVar5);
                            cmsys::SystemTools::CollapseFullPath((string *)local_2e8,&local_358);
                            std::__cxx11::string::operator=
                                      ((string *)local_388._M_local_buf,(string *)local_2e8);
                            if ((undefined1 *)local_2e8._0_8_ != local_2e8 + 0x10) {
                              operator_delete((void *)local_2e8._0_8_,local_2e8._16_8_ + 1);
                            }
                            iVar3 = 0;
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_358._M_dataplus._M_p != &local_358.field_2) {
                              operator_delete(local_358._M_dataplus._M_p,
                                              local_358.field_2._M_allocated_capacity + 1);
                            }
                          }
                          else {
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cerr,"Unknown argument ",0x11);
                            pcVar1 = av_00[uVar7];
                            if (pcVar1 == (char *)0x0) {
                              std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x69c268);
                            }
                            else {
                              sVar5 = strlen(pcVar1);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cerr,pcVar1,sVar5);
                            }
                            std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'h');
                            std::ostream::put('h');
                            std::ostream::flush();
                            std::__cxx11::string::_M_replace
                                      ((ulong)&local_388,0,(char *)local_388._8_8_,0x5944aa);
                          }
                          goto LAB_00252795;
                        }
                        psVar6 = &local_3a8;
                      }
                      pcVar2 = (char *)psVar6->_M_string_length;
                      strlen(pcVar1);
                      std::__cxx11::string::_M_replace((ulong)psVar6,0,pcVar2,(ulong)pcVar1);
                      iVar3 = 0;
                    }
                  }
                }
              }
            }
          }
LAB_00252795:
          uVar7 = uVar7 + 1;
        } while (ac_00 != uVar7);
        if ((char *)local_388._8_8_ == (char *)0x0) goto LAB_00252a24;
        cmake::cmake((cmake *)local_2e8,RoleInternal);
        cmSystemTools::SetMessageCallback(cmakemainMessageCallback,local_2e8);
        cmake::SetProgressCallback((cmake *)local_2e8,cmakemainProgressCallback,(cmake *)local_2e8);
        iVar3 = cmake::Build((cmake *)local_2e8,(string *)&local_388,&local_3a8,&local_338,
                             &local_318,(bool)((byte)local_368 & 1));
        cmake::~cmake((cmake *)local_2e8);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_318);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388._M_allocated_capacity != &local_378) {
        operator_delete((void *)local_388._M_allocated_capacity,
                        CONCAT71(local_378._M_allocated_capacity._1_7_,local_378._M_local_buf[0]) +
                        1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p != &local_338.field_2) {
        operator_delete(local_338._M_dataplus._M_p,
                        CONCAT26(local_338.field_2._M_allocated_capacity._6_2_,
                                 CONCAT24(local_338.field_2._M_allocated_capacity._4_2_,
                                          local_338.field_2._M_allocated_capacity._0_4_)) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
        operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
      }
      goto LAB_0025251e;
    }
    if (((*pcVar1 == '-') && (pcVar1[1] == 'E')) && (pcVar1[2] == '\0')) {
      local_3a8._M_dataplus._M_p = (pointer)0x0;
      local_3a8._M_string_length = 0;
      local_3a8.field_2._M_allocated_capacity = 0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_3a8,(ulong)(ac_00 - 1));
      std::__cxx11::string::string((string *)local_2e8,*av_00,(allocator *)&local_338);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_3a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8);
      if ((undefined1 *)local_2e8._0_8_ != local_2e8 + 0x10) {
        operator_delete((void *)local_2e8._0_8_,local_2e8._16_8_ + 1);
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_insert<char_const*const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_3a8,
                 local_3a8._M_string_length,av_00 + 2,av_00 + ac_00);
      iVar3 = cmcmd::ExecuteCMakeCommand
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_3a8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_3a8);
      goto LAB_0025251e;
    }
  }
  iVar3 = do_cmake(ac_00,av_00);
  cmDynamicLoader::FlushCache();
  loop = uv_default_loop();
  uv_loop_close(loop);
LAB_0025251e:
  cmsys::Encoding::CommandLineArguments::~CommandLineArguments(&local_300);
  return iVar3;
}

Assistant:

int main(int ac, char const* const* av)
{
#if defined(_WIN32) && defined(CMAKE_BUILD_WITH_CMAKE)
  // Replace streambuf so we can output Unicode to console
  cmsys::ConsoleBuf::Manager consoleOut(std::cout);
  consoleOut.SetUTF8Pipes();
  cmsys::ConsoleBuf::Manager consoleErr(std::cerr, true);
  consoleErr.SetUTF8Pipes();
#endif
  cmsys::Encoding::CommandLineArguments args =
    cmsys::Encoding::CommandLineArguments::Main(ac, av);
  ac = args.argc();
  av = args.argv();

#if defined(CMAKE_USE_LIBUV) && defined(_WIN32)
  // Perform libuv one-time initialization now, and then un-do its
  // global _fmode setting so that using libuv does not change the
  // default file text/binary mode.  See libuv issue 840.
  uv_loop_close(uv_default_loop());
#ifdef _MSC_VER
  _set_fmode(_O_TEXT);
#else
  _fmode = _O_TEXT;
#endif
#endif

  cmSystemTools::EnableMSVCDebugHook();
  cmSystemTools::FindCMakeResources(av[0]);
  if (ac > 1) {
    if (strcmp(av[1], "--build") == 0) {
      return do_build(ac, av);
    }
    if (strcmp(av[1], "-E") == 0) {
      return do_command(ac, av);
    }
  }
  int ret = do_cmake(ac, av);
#ifdef CMAKE_BUILD_WITH_CMAKE
  cmDynamicLoader::FlushCache();
#endif
#ifdef CMAKE_USE_LIBUV
  uv_loop_close(uv_default_loop());
#endif
  return ret;
}